

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O3

GF2E __thiscall field::GF2E::inverse(GF2E *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  GF2E GVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  GVar7.data = 1;
  if (msb == '\0') {
    if (this->data == 0) {
      return (GF2E)0;
    }
    uVar13 = this->data;
    uVar10 = modulus;
    uVar11 = 0;
    uVar14 = 1;
    do {
      GVar7.data = uVar14;
      uVar9 = uVar13;
      lVar1 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar12 = (uint)lVar1 ^ 0x3f;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = uVar12 - ((uint)lVar1 ^ 0x3f);
      if (uVar10 == 0 || (int)uVar8 < 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        uVar14 = uVar10;
        do {
          uVar13 = uVar13 | 1L << ((ulong)uVar8 & 0x3f);
          uVar15 = uVar9 << ((byte)uVar8 & 0x3f);
          if (uVar15 == uVar14) break;
          uVar14 = uVar14 ^ uVar15;
          lVar1 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          uVar8 = uVar12 - ((uint)lVar1 ^ 0x3f);
        } while (-1 < (int)uVar8);
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar9;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      auVar2 = (undefined1  [16])0x0;
      for (uVar12 = 0; uVar12 < 0x40; uVar12 = uVar12 + 1) {
        if ((auVar3 & (undefined1  [16])0x1 << uVar12) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar5 << uVar12;
        }
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = GVar7.data;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      auVar3 = (undefined1  [16])0x0;
      for (uVar12 = 0; uVar12 < 0x40; uVar12 = uVar12 + 1) {
        if ((auVar4 & (undefined1  [16])0x1 << uVar12) != (undefined1  [16])0x0) {
          auVar3 = auVar3 ^ auVar6 << uVar12;
        }
      }
      uVar14 = auVar3._0_8_ ^ uVar11;
      bVar16 = auVar2._0_8_ != uVar10;
      uVar13 = auVar2._0_8_ ^ uVar10;
      uVar10 = uVar9;
      uVar11 = GVar7.data;
    } while (bVar16);
  }
  return (GF2E)GVar7.data;
}

Assistant:

GF2E GF2E::inverse() const { return GF2E(mod_inverse(this->data, modulus, msb)); }